

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode ssl_cf_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  long *plVar1;
  undefined8 uVar2;
  byte local_39;
  cf_call_data save;
  CURLcode result;
  ssl_connect_data *connssl;
  _Bool *done_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  plVar1 = (long *)cf->ctx;
  save.data._4_4_ = CURLE_OK;
  *done = true;
  if (((((cf->field_0x24 & 1) != 0) && ((int)plVar1[0x17] == 3)) &&
      (((byte)cf->field_0x24 >> 1 & 1) == 0)) &&
     (Curl_ssl->shut_down != (_func_CURLcode_Curl_cfilter_ptr_Curl_easy_ptr__Bool__Bool_ptr *)0x0))
  {
    uVar2 = *(undefined8 *)((long)cf->ctx + 0x48);
    *(Curl_easy **)((long)cf->ctx + 0x48) = data;
    save.data._4_4_ = (**(code **)(*plVar1 + 0x38))(cf,data,1,done);
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"cf_shutdown -> %d, done=%d",(ulong)save.data._4_4_,
                        (ulong)(*done & 1));
    }
    *(undefined8 *)((long)cf->ctx + 0x48) = uVar2;
    local_39 = 1;
    if (save.data._4_4_ == CURLE_OK) {
      local_39 = *done;
    }
    cf->field_0x24 = cf->field_0x24 & 0xfd | (local_39 & 1) << 1;
  }
  return save.data._4_4_;
}

Assistant:

static CURLcode ssl_cf_shutdown(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                bool *done)
{
  struct ssl_connect_data *connssl = cf->ctx;
  CURLcode result = CURLE_OK;

  *done = TRUE;
  /* If we have done the SSL handshake, shut down the connection cleanly */
  if(cf->connected && (connssl->state == ssl_connection_complete) &&
    !cf->shutdown && Curl_ssl->shut_down) {
    struct cf_call_data save;

    CF_DATA_SAVE(save, cf, data);
    result = connssl->ssl_impl->shut_down(cf, data, TRUE, done);
    CURL_TRC_CF(data, cf, "cf_shutdown -> %d, done=%d", result, *done);
    CF_DATA_RESTORE(cf, save);
    cf->shutdown = (result || *done);
  }
  return result;
}